

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::CamelCaseFieldName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  char *pcVar1;
  AlphaNum *b;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined1 local_38 [8];
  string fieldName;
  FieldDescriptor *field_local;
  
  fieldName.field_2._8_8_ = this;
  UnderscoresToCamelCase_abi_cxx11_((string *)local_38,this,field);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  b = (AlphaNum *)(ulong)(uint)(int)*pcVar1;
  if (0x2f < *pcVar1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar1 < ':') {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_78,"_");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,b);
      goto LAB_01714aa7;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
LAB_01714aa7:
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CamelCaseFieldName(const FieldDescriptor* field) {
  std::string fieldName = UnderscoresToCamelCase(field);
  if ('0' <= fieldName[0] && fieldName[0] <= '9') {
    return absl::StrCat("_", fieldName);
  }
  return fieldName;
}